

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O0

void tabsend_set(t_tabsend *x,t_symbol *s)

{
  int iVar1;
  _garray *x_00;
  _garray *a;
  t_symbol *s_local;
  t_tabsend *x_local;
  
  x->x_arrayname = s;
  x_00 = (_garray *)pd_findbyclass(x->x_arrayname,garray_class);
  if (x_00 == (_garray *)0x0) {
    if (*s->s_name != '\0') {
      pd_error(x,"tabsend~: %s: no such array",x->x_arrayname->s_name);
    }
    x->x_vec = (t_word *)0x0;
  }
  else {
    iVar1 = garray_getfloatwords(x_00,&x->x_npoints,&x->x_vec);
    if (iVar1 == 0) {
      pd_error(x,"%s: bad template for tabsend~",x->x_arrayname->s_name);
      x->x_vec = (t_word *)0x0;
    }
    else {
      garray_usedindsp(x_00);
    }
  }
  return;
}

Assistant:

static void tabsend_set(t_tabsend *x, t_symbol *s)
{
    t_garray *a;

    x->x_arrayname = s;
    if (!(a = (t_garray *)pd_findbyclass(x->x_arrayname, garray_class)))
    {
        if (*s->s_name)
            pd_error(x, "tabsend~: %s: no such array", x->x_arrayname->s_name);
        x->x_vec = 0;
    }
    else if (!garray_getfloatwords(a, &x->x_npoints, &x->x_vec))
    {
        pd_error(x, "%s: bad template for tabsend~", x->x_arrayname->s_name);
        x->x_vec = 0;
    }
    else garray_usedindsp(a);
}